

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

void __thiscall Nova::Timer::Start(Timer *this,int id)

{
  pointer pDVar1;
  ulong uVar2;
  ulong uVar3;
  timeval tv;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  uVar3 = (ulong)id;
  pDVar1 = (this->timers)._data.
           super__Vector_base<Nova::Timer::Data,_std::allocator<Nova::Timer::Data>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->timers)._data.
                 super__Vector_base<Nova::Timer::Data,_std::allocator<Nova::Timer::Data>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pDVar1 >> 3) * -0x5555555555555555;
  if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
    pDVar1[uVar3].start = (double)local_20.tv_usec * 1e-06 + (double)local_20.tv_sec;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void Start(const int id)
    {timers(id).start=Get_Current_Time();}